

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationInternallySynchronizedObjectsTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::synchronization::anon_unknown_0::CreateGraphicThread::runThread
          (TestStatus *__return_storage_ptr__,CreateGraphicThread *this)

{
  Context *context;
  VkPipelineLayout *pipelineLayout;
  VkDescriptorSetLayout *descriptorSetLayout;
  MultiQueues *queues;
  VkRenderPass *renderPass;
  qpTestResult qVar1;
  size_type sVar2;
  DeviceInterface *vk_00;
  VkAllocationCallbacks *device_00;
  reference pCreateInfo;
  Handle<(vk::HandleType)18> *pipeline_00;
  const_reference pvVar3;
  string *msg;
  int iVar4;
  string local_100;
  undefined1 local_e0 [8];
  TestStatus result;
  undefined1 local_b0 [8];
  Move<vk::Handle<(vk::HandleType)18>_> pipeline;
  VkDevice device;
  DeviceInterface *vk;
  int shaderNdx;
  int executionNdx;
  ResultCollector resultCollector;
  CreateGraphicThread *this_local;
  
  resultCollector.m_message.field_2._8_8_ = this;
  tcu::ResultCollector::ResultCollector((ResultCollector *)&shaderNdx);
  for (vk._4_4_ = 0; vk._4_4_ < 100; vk._4_4_ = vk._4_4_ + 1) {
    sVar2 = std::
            vector<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>
            ::size(this->m_pipelineInfo);
    iVar4 = vk._4_4_ % (int)sVar2;
    vk_00 = Context::getDeviceInterface((this->super_ThreadGroupThread).m_context);
    device_00 = (VkAllocationCallbacks *)
                MultiQueues::getDevice((this->super_ThreadGroupThread).m_queues);
    result.m_description.field_2._8_8_ = (this->super_ThreadGroupThread).m_pipelineCache.m_internal;
    pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator = device_00;
    pCreateInfo = std::
                  vector<vk::VkGraphicsPipelineCreateInfo,_std::allocator<vk::VkGraphicsPipelineCreateInfo>_>
                  ::operator[](this->m_pipelineInfo,(long)iVar4);
    ::vk::createGraphicsPipeline
              ((Move<vk::Handle<(vk::HandleType)18>_> *)local_b0,vk_00,(VkDevice)device_00,
               (VkPipelineCache)result.m_description.field_2._8_8_,pCreateInfo,
               (VkAllocationCallbacks *)0x0);
    context = (this->super_ThreadGroupThread).m_context;
    pipeline_00 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_b0);
    pipelineLayout = (this->super_ThreadGroupThread).m_pipelineLayout;
    descriptorSetLayout = (this->super_ThreadGroupThread).m_descriptorSetLayout;
    queues = (this->super_ThreadGroupThread).m_queues;
    renderPass = this->m_renderPass;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((this->super_ThreadGroupThread).m_shadersExecutions,(long)iVar4);
    executeGraphicPipeline
              ((TestStatus *)local_e0,context,pipeline_00,pipelineLayout,descriptorSetLayout,queues,
               renderPass,*pvVar3);
    qVar1 = tcu::TestStatus::getCode((TestStatus *)local_e0);
    msg = tcu::TestStatus::getDescription_abi_cxx11_((TestStatus *)local_e0);
    tcu::ResultCollector::addResult((ResultCollector *)&shaderNdx,qVar1,msg);
    tcu::TestStatus::~TestStatus((TestStatus *)local_e0);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)18>_> *)local_b0);
  }
  qVar1 = tcu::ResultCollector::getResult((ResultCollector *)&shaderNdx);
  tcu::ResultCollector::getMessage_abi_cxx11_(&local_100,(ResultCollector *)&shaderNdx);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,qVar1,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)&shaderNdx);
  return __return_storage_ptr__;
}

Assistant:

TestStatus	runThread		(void)
	{
		ResultCollector		resultCollector;
		for (int executionNdx = 0; executionNdx < EXECUTION_PER_THREAD; ++executionNdx)
		{
			const int shaderNdx					= executionNdx % (int)m_pipelineInfo.size();
			const DeviceInterface&	vk			= m_context.getDeviceInterface();
			const VkDevice			device		= m_queues.getDevice();
			Move<VkPipeline>		pipeline	= createGraphicsPipeline(vk,device, m_pipelineCache, &m_pipelineInfo[shaderNdx]);

			TestStatus result = executeGraphicPipeline(m_context, *pipeline, m_pipelineLayout, m_descriptorSetLayout, m_queues, m_renderPass, m_shadersExecutions[shaderNdx]);
			resultCollector.addResult(result.getCode(), result.getDescription());
		}
		return TestStatus(resultCollector.getResult(), resultCollector.getMessage());
	}